

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

string * __thiscall
cs_impl::any::holder<cs::range_type>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,holder<cs::range_type> *this)

{
  bool bVar1;
  string *psVar2;
  string str;
  
  bVar1 = cs::numeric::operator==(&(this->mDat).m_start,&(this->mDat).m_stop);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x676e61723a3a7363;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 7) = 0x7d7b203e3d206567;
    __return_storage_ptr__->_M_string_length = 0xf;
    (__return_storage_ptr__->field_2)._M_local_buf[0xf] = '\0';
    return __return_storage_ptr__;
  }
  psVar2 = (string *)
           (*(code *)(&DAT_001eb0a0 +
                     *(int *)(&DAT_001eb0a0 +
                             (ulong)((uint)(this->mDat).m_stop.type +
                                    ((this->mDat).m_start.type & 1) * 2) * 4)))();
  return psVar2;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}